

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5StorageSaveTotals(Fts5Storage *p)

{
  Fts5Index *p_00;
  long lVar1;
  long lVar2;
  int rc;
  Fts5Buffer buf;
  int local_3c;
  Fts5Buffer local_38;
  
  lVar1 = (long)p->pConfig->nCol;
  local_3c = 0;
  local_38.p = (u8 *)0x0;
  local_38.n = 0;
  local_38.nSpace = 0;
  sqlite3Fts5BufferAppendVarint(&local_3c,&local_38,p->nTotalRow);
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      sqlite3Fts5BufferAppendVarint(&local_3c,&local_38,p->aTotalSize[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  if (local_3c == 0) {
    p_00 = p->pIndex;
    fts5DataWrite(p_00,1,local_38.p,local_38.n);
    local_3c = p_00->rc;
    p_00->rc = 0;
  }
  sqlite3_free(local_38.p);
  return local_3c;
}

Assistant:

static int fts5StorageSaveTotals(Fts5Storage *p){
  int nCol = p->pConfig->nCol;
  int i;
  Fts5Buffer buf;
  int rc = SQLITE_OK;
  memset(&buf, 0, sizeof(buf));

  sqlite3Fts5BufferAppendVarint(&rc, &buf, p->nTotalRow);
  for(i=0; i<nCol; i++){
    sqlite3Fts5BufferAppendVarint(&rc, &buf, p->aTotalSize[i]);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexSetAverages(p->pIndex, buf.p, buf.n);
  }
  sqlite3_free(buf.p);

  return rc;
}